

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void state_TEXM3X2TEX(Context *ctx)

{
  bool bVar1;
  uint uVar2;
  RegisterList *pRVar3;
  byte bVar4;
  RegisterList *pRVar5;
  uint uVar6;
  
  bVar4 = 0;
  if (ctx->minor_ver != 0xff) {
    bVar4 = ctx->minor_ver;
  }
  if (0x10003 < ((uint)bVar4 | (uint)ctx->major_ver << 0x10)) {
    failf(ctx,"%s","TEXM3X2TEX opcode not available after Shader Model 1.3");
  }
  if (ctx->texm3x2pad_dst0 == -1) {
    failf(ctx,"%s","TEXM3X2TEX opcode without matching TEXM3X2PAD");
  }
  pRVar3 = (RegisterList *)0x0;
  state_texops(ctx,"TEXM3X2TEX",2,0);
  ctx->reset_texmpad = 1;
  uVar2 = (ctx->dest_arg).regnum | 0xa0000;
  pRVar5 = (ctx->samplers).next;
  do {
    if (pRVar5 == (RegisterList *)0x0) {
      pRVar3 = (RegisterList *)0x0;
      break;
    }
    uVar6 = pRVar5->regtype << 0x10 | pRVar5->regnum;
    if (uVar2 == uVar6) {
      bVar1 = false;
      pRVar3 = pRVar5;
    }
    else if (uVar2 < uVar6) {
      pRVar3 = (RegisterList *)0x0;
      bVar1 = false;
    }
    else {
      pRVar5 = pRVar5->next;
      bVar1 = true;
    }
  } while (bVar1);
  if ((pRVar3 != (RegisterList *)0x0) && (pRVar3->index == 2)) {
    return;
  }
  failf(ctx,"%s","TEXM3X2TEX needs a 2D sampler");
  return;
}

Assistant:

static void state_TEXM3X2TEX(Context *ctx)
{
    if (shader_version_atleast(ctx, 1, 4))
        fail(ctx, "TEXM3X2TEX opcode not available after Shader Model 1.3");
    if (ctx->texm3x2pad_dst0 == -1)
        fail(ctx, "TEXM3X2TEX opcode without matching TEXM3X2PAD");
    // !!! FIXME: check for correct opcode existance and order more rigorously?
    state_texops(ctx, "TEXM3X2TEX", 2, 0);
    ctx->reset_texmpad = 1;

    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER,
                                      ctx->dest_arg.regnum);
    const TextureType ttype = (TextureType) (sreg ? sreg->index : 0);

    // A samplermap might change this to something nonsensical.
    if (ttype != TEXTURE_TYPE_2D)
        fail(ctx, "TEXM3X2TEX needs a 2D sampler");
}